

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

bool __thiscall
CLIntercept::overrideGetDeviceInfo
          (CLIntercept *this,cl_device_id device,cl_device_info param_name,size_t param_value_size,
          void *param_value,size_t *param_value_size_ret,cl_int *errorCode)

{
  size_type sVar1;
  pointer pcVar2;
  undefined1 uVar3;
  bool bVar4;
  uint uVar5;
  cl_uint cVar6;
  cl_int cVar7;
  cl_device_type d;
  uint uVar8;
  ulong uVar9;
  undefined8 uVar10;
  char *pcVar11;
  char *pcVar12;
  size_t __n;
  cl_device_type *ptr;
  cl_device_svm_capabilities svmCaps;
  size_t minor;
  char *local_60;
  char *local_58;
  long local_50;
  char local_48 [16];
  size_t local_38;
  
  uVar8 = 0;
  uVar5 = uVar8;
  if (0x105a < (int)param_name) {
    switch(param_name) {
    case 0x105b:
      sVar1 = (this->m_Config).DeviceILVersion._M_string_length;
      uVar5 = 0;
      if (sVar1 == 0) goto switchD_0018736a_caseD_1003;
      __n = sVar1 + 1;
      if ((param_value != (void *)0x0) && (uVar5 = 0xffffffe2, __n <= param_value_size)) {
        pcVar11 = (this->m_Config).DeviceILVersion._M_dataplus._M_p;
        goto LAB_001879f2;
      }
      goto LAB_00187a05;
    case 0x105c:
    case 0x105d:
      goto switchD_0018736a_caseD_1003;
    case 0x105e:
      if ((this->m_Config).Emulate_cl_khr_extended_versioning == true) {
        local_58 = (char *)0x0;
        cVar7 = allocateAndGetDeviceInfoString(this,device,0x102f,&local_58);
        *errorCode = cVar7;
        uVar5 = (uint)(local_58 != (char *)0x0 && cVar7 == 0);
        if (local_58 != (char *)0x0 && cVar7 == 0) {
          pcVar11 = "OpenCL ";
          goto LAB_00187756;
        }
LAB_00187a70:
        pcVar12 = local_58;
        if (local_58 == (char *)0x0) goto switchD_0018736a_caseD_1003;
LAB_00187a79:
        operator_delete__(pcVar12);
        goto switchD_0018736a_caseD_1003;
      }
      break;
    case 0x105f:
      if ((this->m_Config).Emulate_cl_khr_extended_versioning == true) {
        local_58 = (char *)0x0;
        cVar7 = allocateAndGetDeviceInfoString(this,device,0x103d,&local_58);
        *errorCode = cVar7;
        uVar5 = (uint)(local_58 != (char *)0x0 && cVar7 == 0);
        if (local_58 == (char *)0x0 || cVar7 != 0) goto LAB_00187a70;
        pcVar11 = "OpenCL C ";
LAB_00187756:
        pcVar12 = local_58;
        local_38 = 0;
        local_60 = (char *)0x0;
        cVar7 = 0;
        getMajorMinorVersionFromString(this,pcVar11,local_58,(size_t *)&local_60,&local_38);
        if ((param_value != (void *)0x0) && (cVar7 = -0x1e, 3 < param_value_size)) {
          *(uint *)param_value = ((uint)local_38 & 0x3ff) << 0xc | (int)local_60 << 0x16;
          cVar7 = 0;
        }
        if (param_value_size_ret != (size_t *)0x0) {
          *param_value_size_ret = 4;
        }
        *errorCode = cVar7;
        goto LAB_00187a79;
      }
      break;
    case 0x1060:
      if ((this->m_Config).Emulate_cl_khr_extended_versioning != true) break;
      local_50 = 0;
      local_48[0] = '\0';
      local_58 = local_48;
      bVar4 = checkDeviceForExtension(this,device,"cl_khr_extended_versioning");
      if (!bVar4) {
        std::__cxx11::string::append((char *)&local_58);
      }
      if (((this->m_Config).Emulate_cl_intel_unified_shared_memory == true) &&
         (bVar4 = checkDeviceForExtension(this,device,"cl_intel_unified_shared_memory"), !bVar4)) {
        std::__cxx11::string::append((char *)&local_58);
      }
      local_60 = (char *)0x0;
      allocateAndGetDeviceInfoString(this,device,0x1030,&local_60);
      pcVar11 = local_60;
      std::__cxx11::string::append((char *)&local_58);
      cVar7 = parseExtensionString
                        (local_58,(cl_name_version_khr *)param_value,param_value_size,
                         param_value_size_ret);
      *errorCode = cVar7;
      if (pcVar11 != (char *)0x0) {
        operator_delete__(pcVar11);
      }
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      goto LAB_00187a0f;
    case 0x1061:
      if ((this->m_Config).Emulate_cl_khr_extended_versioning == true) {
        local_58 = (char *)0x0;
        allocateAndGetDeviceInfoString(this,device,0x105b,&local_58);
        pcVar11 = local_58;
        cVar7 = parseILString(local_58,(cl_name_version_khr *)param_value,param_value_size,
                              param_value_size_ret);
LAB_001877ea:
        *errorCode = cVar7;
        if (pcVar11 != (char *)0x0) {
          operator_delete__(pcVar11);
        }
        goto LAB_00187a0f;
      }
      break;
    case 0x1062:
      if ((this->m_Config).Emulate_cl_khr_extended_versioning == true) {
        local_58 = (char *)0x0;
        allocateAndGetDeviceInfoString(this,device,0x103f,&local_58);
        pcVar11 = local_58;
        cVar7 = parseBuiltInKernelsString
                          (local_58,(cl_name_version_khr *)param_value,param_value_size,
                           param_value_size_ret);
        goto LAB_001877ea;
      }
      break;
    default:
      uVar9 = (ulong)(param_name - 0x4190);
      if (4 < param_name - 0x4190) {
        if (param_name != 0x204c) goto switchD_0018736a_caseD_1003;
        uVar5 = 0;
        if ((this->m_Config).Emulate_cl_khr_semaphore != true) goto switchD_0018736a_caseD_1003;
        uVar5 = 0;
        if ((param_value != (void *)0x0) && (uVar5 = 0xffffffe2, 3 < param_value_size)) {
          *(undefined4 *)param_value = 1;
          uVar5 = 0;
        }
        if (param_value_size_ret != (size_t *)0x0) {
          *param_value_size_ret = 4;
        }
        goto LAB_00187a0d;
      }
      if ((this->m_Config).Emulate_cl_intel_unified_shared_memory == true) {
        local_58 = (char *)0x0;
        (*(this->m_Dispatch).clGetDeviceInfo)(device,0x1053,8,&local_58,(size_t *)0x0);
        if (((ulong)local_58 & 4) == 0) {
          if (((ulong)local_58 & 2) != 0) {
            uVar3 = (*(code *)(&DAT_001a5f1c + *(int *)(&DAT_001a5f1c + uVar9 * 4)))
                              (&DAT_001a5f1c + *(int *)(&DAT_001a5f1c + uVar9 * 4),0,
                               ((uint)local_58 & 8) + 3);
            return (bool)uVar3;
          }
          uVar5 = -((uint)local_58 & 1) & 3;
          uVar10 = 0;
        }
        else {
          if (((ulong)local_58 & 8) != 0) {
            uVar3 = (*(code *)(&DAT_001a5f1c + *(int *)(&DAT_001a5f1c + uVar9 * 4)))
                              (&DAT_001a5f1c + *(int *)(&DAT_001a5f1c + uVar9 * 4),0xf,0xb);
            return (bool)uVar3;
          }
          uVar5 = 3;
          uVar10 = 7;
        }
        uVar3 = (*(code *)(&DAT_001a5f1c + *(int *)(&DAT_001a5f1c + uVar9 * 4)))
                          (&DAT_001a5f1c + *(int *)(&DAT_001a5f1c + uVar9 * 4),uVar10,uVar5);
        return (bool)uVar3;
      }
    }
LAB_00187c69:
    uVar5 = 0;
    goto switchD_0018736a_caseD_1003;
  }
  uVar5 = 0;
  switch(param_name) {
  case 0x1000:
    uVar9 = (ulong)(this->m_Config).DeviceType;
    uVar5 = 0;
    if (uVar9 == 0) goto switchD_0018736a_caseD_1003;
    uVar5 = 0;
    if ((param_value != (void *)0x0) && (uVar5 = 0xffffffe2, 7 < param_value_size)) {
      *(ulong *)param_value = uVar9;
      uVar5 = 0;
    }
    if (param_value_size_ret != (size_t *)0x0) {
      *param_value_size_ret = 8;
    }
    goto LAB_00187a0d;
  case 0x1001:
    cVar6 = (this->m_Config).DeviceVendorID;
    goto LAB_00187851;
  case 0x1002:
    cVar6 = (this->m_Config).DeviceMaxComputeUnits;
LAB_00187851:
    uVar5 = 0;
    if (cVar6 == 0) goto switchD_0018736a_caseD_1003;
    goto LAB_0018786f;
  case 0x1003:
  case 0x1004:
  case 0x1005:
    goto switchD_0018736a_caseD_1003;
  case 0x1006:
    cVar6 = (this->m_Config).DevicePreferredVectorWidthChar;
    break;
  case 0x1007:
    cVar6 = (this->m_Config).DevicePreferredVectorWidthShort;
    break;
  case 0x1008:
    cVar6 = (this->m_Config).DevicePreferredVectorWidthInt;
    break;
  case 0x1009:
    cVar6 = (this->m_Config).DevicePreferredVectorWidthLong;
    break;
  case 0x100a:
    cVar6 = (this->m_Config).DevicePreferredVectorWidthFloat;
    break;
  case 0x100b:
    cVar6 = (this->m_Config).DevicePreferredVectorWidthDouble;
    break;
  default:
    uVar5 = uVar8;
    switch(param_name) {
    case 0x102b:
      sVar1 = (this->m_Config).DeviceName._M_string_length;
      uVar5 = 0;
      if (sVar1 == 0) goto switchD_0018736a_caseD_1003;
      __n = sVar1 + 1;
      if ((param_value != (void *)0x0) && (uVar5 = 0xffffffe2, __n <= param_value_size)) {
        pcVar11 = (this->m_Config).DeviceName._M_dataplus._M_p;
LAB_001879f2:
        strncpy((char *)param_value,pcVar11,__n);
        uVar5 = 0;
      }
      break;
    case 0x102c:
      sVar1 = (this->m_Config).DeviceVendor._M_string_length;
      uVar5 = 0;
      if (sVar1 == 0) goto switchD_0018736a_caseD_1003;
      __n = sVar1 + 1;
      if ((param_value != (void *)0x0) && (uVar5 = 0xffffffe2, __n <= param_value_size)) {
        pcVar11 = (this->m_Config).DeviceVendor._M_dataplus._M_p;
        goto LAB_001879f2;
      }
      break;
    case 0x102d:
      sVar1 = (this->m_Config).DriverVersion._M_string_length;
      uVar5 = 0;
      if (sVar1 == 0) goto switchD_0018736a_caseD_1003;
      __n = sVar1 + 1;
      if ((param_value != (void *)0x0) && (uVar5 = 0xffffffe2, __n <= param_value_size)) {
        pcVar11 = (this->m_Config).DriverVersion._M_dataplus._M_p;
        goto LAB_001879f2;
      }
      break;
    case 0x102e:
      sVar1 = (this->m_Config).DeviceProfile._M_string_length;
      uVar5 = 0;
      if (sVar1 == 0) goto switchD_0018736a_caseD_1003;
      __n = sVar1 + 1;
      if ((param_value != (void *)0x0) && (uVar5 = 0xffffffe2, __n <= param_value_size)) {
        pcVar11 = (this->m_Config).DeviceProfile._M_dataplus._M_p;
        goto LAB_001879f2;
      }
      break;
    case 0x102f:
      sVar1 = (this->m_Config).DeviceVersion._M_string_length;
      uVar5 = 0;
      if (sVar1 == 0) goto switchD_0018736a_caseD_1003;
      __n = sVar1 + 1;
      if ((param_value != (void *)0x0) && (uVar5 = 0xffffffe2, __n <= param_value_size)) {
        pcVar11 = (this->m_Config).DeviceVersion._M_dataplus._M_p;
        goto LAB_001879f2;
      }
      break;
    case 0x1030:
      sVar1 = (this->m_Config).DeviceExtensions._M_string_length;
      if (sVar1 != 0) {
        uVar9 = sVar1 + 1;
        cVar7 = 0;
        if ((param_value != (void *)0x0) && (cVar7 = -0x1e, uVar9 <= param_value_size)) {
          strncpy((char *)param_value,(this->m_Config).DeviceExtensions._M_dataplus._M_p,uVar9);
          cVar7 = 0;
        }
        if (param_value_size_ret != (size_t *)0x0) {
          *param_value_size_ret = uVar9;
        }
        *errorCode = cVar7;
        goto LAB_00187a0f;
      }
      sVar1 = (this->m_Config).PrependDeviceExtensions._M_string_length;
      if ((((sVar1 == 0) && ((this->m_Config).Emulate_cl_khr_extended_versioning == false)) &&
          ((this->m_Config).Emulate_cl_khr_semaphore == false)) &&
         ((this->m_Config).Emulate_cl_intel_unified_shared_memory != true)) goto LAB_00187c69;
      pcVar2 = (this->m_Config).PrependDeviceExtensions._M_dataplus._M_p;
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char*>((string *)&local_58,pcVar2,pcVar2 + sVar1);
      if ((local_50 != 0) && (local_58[local_50 + -1] != ' ')) {
        std::__cxx11::string::push_back((char)&local_58);
      }
      if (((this->m_Config).Emulate_cl_khr_extended_versioning == true) &&
         (bVar4 = checkDeviceForExtension(this,device,"cl_khr_extended_versioning"), !bVar4)) {
        std::__cxx11::string::append((char *)&local_58);
      }
      if (((this->m_Config).Emulate_cl_khr_semaphore == true) &&
         (bVar4 = checkDeviceForExtension(this,device,"cl_khr_semaphore"), !bVar4)) {
        std::__cxx11::string::append((char *)&local_58);
      }
      if (((this->m_Config).Emulate_cl_intel_unified_shared_memory == true) &&
         (bVar4 = checkDeviceForExtension(this,device,"cl_intel_unified_shared_memory"), !bVar4)) {
        std::__cxx11::string::append((char *)&local_58);
      }
      if (local_50 == 0) {
        uVar5 = 0;
      }
      else {
        local_60 = (char *)0x0;
        cVar7 = allocateAndGetDeviceInfoString(this,device,0x1030,&local_60);
        pcVar11 = local_60;
        uVar5 = (uint)(local_60 != (char *)0x0 && cVar7 == 0);
        if (local_60 != (char *)0x0 && cVar7 == 0) {
          std::__cxx11::string::append((char *)&local_58);
          uVar9 = local_50 + 1;
          if (uVar9 <= param_value_size && param_value != (void *)0x0) {
            strncpy((char *)param_value,local_58,uVar9);
          }
          if (param_value_size_ret != (size_t *)0x0) {
            *param_value_size_ret = uVar9;
          }
        }
        else if (local_60 == (char *)0x0) goto LAB_00187c8d;
        operator_delete__(pcVar11);
      }
LAB_00187c8d:
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
    default:
      goto switchD_0018736a_caseD_1003;
    case 0x1034:
      cVar6 = (this->m_Config).DevicePreferredVectorWidthHalf;
      goto LAB_00187864;
    case 0x103d:
      sVar1 = (this->m_Config).DeviceCVersion._M_string_length;
      uVar5 = 0;
      if (sVar1 == 0) goto switchD_0018736a_caseD_1003;
      __n = sVar1 + 1;
      uVar5 = 0;
      if ((param_value != (void *)0x0) && (uVar5 = 0xffffffe2, __n <= param_value_size)) {
        pcVar11 = (this->m_Config).DeviceCVersion._M_dataplus._M_p;
        goto LAB_001879f2;
      }
    }
LAB_00187a05:
    if (param_value_size_ret != (size_t *)0x0) {
      *param_value_size_ret = __n;
    }
    goto LAB_00187a0d;
  }
LAB_00187864:
  uVar5 = 0;
  if (cVar6 != 0xffffffff) {
LAB_0018786f:
    uVar5 = 0;
    if ((param_value != (void *)0x0) && (uVar5 = 0xffffffe2, 3 < param_value_size)) {
      *(cl_uint *)param_value = cVar6;
      uVar5 = 0;
    }
    if (param_value_size_ret != (size_t *)0x0) {
      *param_value_size_ret = 4;
    }
LAB_00187a0d:
    *errorCode = uVar5;
LAB_00187a0f:
    uVar5 = 1;
  }
switchD_0018736a_caseD_1003:
  return SUB41(uVar5,0);
}

Assistant:

bool CLIntercept::overrideGetDeviceInfo(
    cl_device_id device,
    cl_device_info param_name,
    size_t param_value_size,
    void* param_value,
    size_t* param_value_size_ret,
    cl_int& errorCode ) const
{
    bool    override = false;

    switch( param_name )
    {
    case CL_DEVICE_TYPE:
        if( m_Config.DeviceType != 0 )
        {
            cl_device_type* ptr = (cl_device_type*)param_value;
            cl_device_type  d = m_Config.DeviceType;
            errorCode = writeParamToMemory(
                param_value_size,
                d,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_NAME:
        if( !m_Config.DeviceName.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceName,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_EXTENSIONS:
        if( !m_Config.DeviceExtensions.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceExtensions,
                param_value_size_ret,
                ptr );
            override = true;
        }
        else if( !m_Config.PrependDeviceExtensions.empty() ||
                 m_Config.Emulate_cl_khr_extended_versioning ||
                 m_Config.Emulate_cl_khr_semaphore ||
                 m_Config.Emulate_cl_intel_unified_shared_memory )
        {
            std::string newExtensions(m_Config.PrependDeviceExtensions);
            if( !newExtensions.empty() && newExtensions.back() != ' ' )
            {
                newExtensions.push_back(' ');
            }
            if( m_Config.Emulate_cl_khr_extended_versioning &&
                !checkDeviceForExtension( device, "cl_khr_extended_versioning") )
            {
                newExtensions += "cl_khr_extended_versioning ";
            }
            if( m_Config.Emulate_cl_khr_semaphore &&
                !checkDeviceForExtension( device, "cl_khr_semaphore") )
            {
                newExtensions += "cl_khr_semaphore ";
            }
            if( m_Config.Emulate_cl_intel_unified_shared_memory &&
                !checkDeviceForExtension( device, "cl_intel_unified_shared_memory") )
            {
                newExtensions += "cl_intel_unified_shared_memory ";
            }

            if( !newExtensions.empty() )
            {
                char*   deviceExtensions = NULL;
                cl_int  errorCode = allocateAndGetDeviceInfoString(
                    device,
                    CL_DEVICE_EXTENSIONS,
                    deviceExtensions );
                if( errorCode == CL_SUCCESS && deviceExtensions )
                {
                    newExtensions += deviceExtensions;

                    char*   ptr = (char*)param_value;
                    errorCode = writeStringToMemory(
                        param_value_size,
                        newExtensions,
                        param_value_size_ret,
                        ptr );
                    override = true;
                }
                delete [] deviceExtensions;
            }
        }
        break;
    case CL_DEVICE_VENDOR:
        if( !m_Config.DeviceVendor.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceVendor,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PROFILE:
        if( !m_Config.DeviceProfile.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceProfile,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_VERSION:
        if( !m_Config.DeviceVersion.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceVersion,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_OPENCL_C_VERSION:
        if( !m_Config.DeviceCVersion.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceCVersion,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_IL_VERSION:
        if( !m_Config.DeviceILVersion.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceILVersion,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_VENDOR_ID:
        if( m_Config.DeviceVendorID != 0 )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DeviceVendorID,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_MAX_COMPUTE_UNITS:
        if( m_Config.DeviceMaxComputeUnits != 0 )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DeviceMaxComputeUnits,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_CHAR:
        if( m_Config.DevicePreferredVectorWidthChar != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthChar,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_SHORT:
        if( m_Config.DevicePreferredVectorWidthShort != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthShort,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_INT:
        if( m_Config.DevicePreferredVectorWidthInt != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthInt,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_LONG:
        if( m_Config.DevicePreferredVectorWidthLong != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthLong,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_HALF:
        if( m_Config.DevicePreferredVectorWidthHalf != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthHalf,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_FLOAT:
        if( m_Config.DevicePreferredVectorWidthFloat != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthFloat,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_DOUBLE:
        if( m_Config.DevicePreferredVectorWidthDouble != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthDouble,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_NUMERIC_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   deviceVersion = NULL;

            errorCode = allocateAndGetDeviceInfoString(
                device,
                CL_DEVICE_VERSION,
                deviceVersion );
            if( errorCode == CL_SUCCESS && deviceVersion )
            {
                // According to the spec, the device version string should have the form:
                //   OpenCL <Major>.<Minor> <Vendor Specific Info>
                size_t  major = 0;
                size_t  minor = 0;
                if( getMajorMinorVersionFromString(
                        "OpenCL ",
                        deviceVersion,
                        major,
                        minor ) )
                {
                    cl_version_khr* ptr = (cl_version_khr*)param_value;
                    cl_version_khr  version = CL_MAKE_VERSION_KHR( major, minor, 0 );
                    errorCode = writeParamToMemory(
                        param_value_size,
                        version,
                        param_value_size_ret,
                        ptr );
                    override = true;
                }
            }

            delete [] deviceVersion;
            deviceVersion = NULL;
        }
        break;
    case CL_DEVICE_OPENCL_C_NUMERIC_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   deviceOpenCLCVersion = NULL;

            errorCode = allocateAndGetDeviceInfoString(
                device,
                CL_DEVICE_OPENCL_C_VERSION,
                deviceOpenCLCVersion );
            if( errorCode == CL_SUCCESS && deviceOpenCLCVersion )
            {
                // According to the spec, the OpenCL C version string should have the form:
                //   OpenCL C <Major>.<Minor> <Vendor Specific Info>
                size_t  major = 0;
                size_t  minor = 0;
                if( getMajorMinorVersionFromString(
                        "OpenCL C ",
                        deviceOpenCLCVersion,
                        major,
                        minor ) )
                {
                    cl_version_khr* ptr = (cl_version_khr*)param_value;
                    cl_version_khr  version = CL_MAKE_VERSION_KHR( major, minor, 0 );
                    errorCode = writeParamToMemory(
                        param_value_size,
                        version,
                        param_value_size_ret,
                        ptr );
                    override = true;
                }
            }

            delete [] deviceOpenCLCVersion;
            deviceOpenCLCVersion = NULL;
        }
        break;
    case CL_DEVICE_EXTENSIONS_WITH_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            std::string deviceExtensions;
            if( m_Config.Emulate_cl_khr_extended_versioning &&
                !checkDeviceForExtension( device, "cl_khr_extended_versioning") )
            {
                deviceExtensions += "cl_khr_extended_versioning ";
            }
            if( m_Config.Emulate_cl_intel_unified_shared_memory &&
                !checkDeviceForExtension( device, "cl_intel_unified_shared_memory") )
            {
                deviceExtensions += "cl_intel_unified_shared_memory ";
            }

            char*   tempDeviceExtensions = NULL;

            allocateAndGetDeviceInfoString(
                device,
                CL_DEVICE_EXTENSIONS,
                tempDeviceExtensions );
            deviceExtensions += tempDeviceExtensions;

            // Parse the extension string even if the query returned an error.
            // In this case we will simply return that zero extensions are supported.
            cl_name_version_khr*    ptr = (cl_name_version_khr*)param_value;
            errorCode = parseExtensionString(
                deviceExtensions.c_str(),
                ptr,
                param_value_size,
                param_value_size_ret );
            override = true;

            delete [] tempDeviceExtensions;
            tempDeviceExtensions = NULL;
        }
        break;
    case CL_DEVICE_ILS_WITH_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   deviceILs = NULL;

            allocateAndGetDeviceInfoString(
                device,
                CL_DEVICE_IL_VERSION,
                deviceILs );

            // Parse the extension string even if the query returned an error.
            // In this case we will simply return that zero ILs are supported.
            cl_name_version_khr*    ptr = (cl_name_version_khr*)param_value;
            errorCode = parseILString(
                deviceILs,
                ptr,
                param_value_size,
                param_value_size_ret );
            override = true;

            delete [] deviceILs;
            deviceILs = NULL;
        }
        break;
    case CL_DEVICE_BUILT_IN_KERNELS_WITH_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   deviceBuiltInKernels = NULL;

            allocateAndGetDeviceInfoString(
                device,
                CL_DEVICE_BUILT_IN_KERNELS,
                deviceBuiltInKernels );

            // Parse the built-in kernels string even if the query returned
            // an error.  In this case we will simply return that zero
            // built-in kernels are supported.
            cl_name_version_khr*    ptr = (cl_name_version_khr*)param_value;
            errorCode = parseBuiltInKernelsString(
                deviceBuiltInKernels,
                ptr,
                param_value_size,
                param_value_size_ret );
            override = true;

            delete [] deviceBuiltInKernels;
            deviceBuiltInKernels = NULL;
        }
        break;
    case CL_DRIVER_VERSION:
        if( !m_Config.DriverVersion.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DriverVersion,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_HOST_MEM_CAPABILITIES_INTEL:
    case CL_DEVICE_DEVICE_MEM_CAPABILITIES_INTEL:
    case CL_DEVICE_SINGLE_DEVICE_SHARED_MEM_CAPABILITIES_INTEL:
    case CL_DEVICE_CROSS_DEVICE_SHARED_MEM_CAPABILITIES_INTEL:
    case CL_DEVICE_SHARED_SYSTEM_MEM_CAPABILITIES_INTEL:
        if( m_Config.Emulate_cl_intel_unified_shared_memory )
        {
            // Shorthand:
            const cl_bitfield acc = CL_UNIFIED_SHARED_MEMORY_ACCESS_INTEL;
            const cl_bitfield ato = CL_UNIFIED_SHARED_MEMORY_ATOMIC_ACCESS_INTEL;
            const cl_bitfield cacc = CL_UNIFIED_SHARED_MEMORY_CONCURRENT_ACCESS_INTEL;
            const cl_bitfield cato = CL_UNIFIED_SHARED_MEMORY_CONCURRENT_ATOMIC_ACCESS_INTEL;

            // Caps:
            cl_device_unified_shared_memory_capabilities_intel hostCaps = 0;
            cl_device_unified_shared_memory_capabilities_intel deviceCaps = 0;
            cl_device_unified_shared_memory_capabilities_intel sdSharedCaps = 0;
            cl_device_unified_shared_memory_capabilities_intel cdSharedCaps = 0;
            cl_device_unified_shared_memory_capabilities_intel sysSharedCaps = 0;

            cl_device_svm_capabilities svmCaps = 0;
            dispatch().clGetDeviceInfo(
                device,
                CL_DEVICE_SVM_CAPABILITIES,
                sizeof(svmCaps),
                &svmCaps,
                NULL );
            if( svmCaps & CL_DEVICE_SVM_FINE_GRAIN_SYSTEM )
            {
                //log( "Returning USM caps for: System SVM\n" );
                hostCaps =      acc | ato | cacc;
                deviceCaps =    acc | ato;
                sdSharedCaps =  acc | ato | cacc;
                cdSharedCaps =  acc | ato | cacc;
                sysSharedCaps = acc | ato | cacc;
                if( svmCaps & CL_DEVICE_SVM_ATOMICS )
                {
                    hostCaps |=      cato;
                    deviceCaps |=    cato;
                    sdSharedCaps |=  cato;
                    cdSharedCaps |=  cato;
                    sysSharedCaps |= cato;
                }
            }
            else if( svmCaps & CL_DEVICE_SVM_FINE_GRAIN_BUFFER )
            {
                //log( "Returning USM caps for: Fine Grain Buffer SVM\n" );
                hostCaps =      acc | ato | cacc;
                deviceCaps =    acc | ato;
                sdSharedCaps =  acc | ato | cacc;
                cdSharedCaps =  acc | ato | cacc;
                if( svmCaps & CL_DEVICE_SVM_ATOMICS )
                {
                    hostCaps |=     cato;
                    deviceCaps |=   cato;
                    sdSharedCaps |= cato;
                    cdSharedCaps |=   cato;
                }
            }
            else if( svmCaps & CL_DEVICE_SVM_COARSE_GRAIN_BUFFER )
            {
                //log( "Returning USM caps for: Coarse Grain Buffer SVM\n" );
                deviceCaps = acc | ato;
            }

            cl_device_unified_shared_memory_capabilities_intel*    ptr =
                (cl_device_unified_shared_memory_capabilities_intel*)param_value;

            switch( param_name )
            {
            case CL_DEVICE_HOST_MEM_CAPABILITIES_INTEL:
                errorCode = writeParamToMemory(
                    param_value_size,
                    hostCaps,
                    param_value_size_ret,
                    ptr );
                override = true;
                break;
            case CL_DEVICE_DEVICE_MEM_CAPABILITIES_INTEL:
                errorCode = writeParamToMemory(
                    param_value_size,
                    deviceCaps,
                    param_value_size_ret,
                    ptr );
                override = true;
                break;
            case CL_DEVICE_SINGLE_DEVICE_SHARED_MEM_CAPABILITIES_INTEL:
                errorCode = writeParamToMemory(
                    param_value_size,
                    sdSharedCaps,
                    param_value_size_ret,
                    ptr );
                override = true;
                break;
            case CL_DEVICE_CROSS_DEVICE_SHARED_MEM_CAPABILITIES_INTEL:
                errorCode = writeParamToMemory(
                    param_value_size,
                    cdSharedCaps,
                    param_value_size_ret,
                    ptr );
                override = true;
                break;
            case CL_DEVICE_SHARED_SYSTEM_MEM_CAPABILITIES_INTEL:
                errorCode = writeParamToMemory(
                    param_value_size,
                    sysSharedCaps,
                    param_value_size_ret,
                    ptr );
                override = true;
                break;
            default:
                break;
            }
        }
        break;
    case CL_DEVICE_SEMAPHORE_TYPES_KHR:
        if( m_Config.Emulate_cl_khr_semaphore )
        {
            // If we decide to emulate multiple semaphore types we will need
            // to return an array, but for now we can return just the binary
            // semaphore type.
            auto    ptr = (cl_semaphore_type_khr*)param_value;
            cl_semaphore_type_khr type = CL_SEMAPHORE_TYPE_BINARY_KHR;
            errorCode = writeParamToMemory(
                param_value_size,
                type,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    default:
        break;
    }

    return override;
}